

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O0

t_int * vinlet_doprolog(t_int *w)

{
  long lVar1;
  int local_44;
  t_sample *ptStack_40;
  int nshift;
  t_sample *f2;
  t_sample *f1;
  t_sample *out;
  t_sample *ptStack_20;
  int n;
  t_sample *in;
  t_vinlet *x;
  t_int *w_local;
  
  lVar1 = w[1];
  ptStack_20 = (t_sample *)w[2];
  out._4_4_ = (int)w[3];
  f1 = *(t_sample **)(lVar1 + 0x58);
  if (f1 == *(t_sample **)(lVar1 + 0x50)) {
    f1 = f1 + -(long)*(int *)(lVar1 + 0x68);
    local_44 = *(int *)(lVar1 + 0x40) - *(int *)(lVar1 + 0x68);
    ptStack_40 = (t_sample *)(*(long *)(lVar1 + 0x48) + (long)*(int *)(lVar1 + 0x68) * 4);
    f2 = *(t_sample **)(lVar1 + 0x48);
    while (local_44 != 0) {
      *f2 = *ptStack_40;
      local_44 = local_44 + -1;
      ptStack_40 = ptStack_40 + 1;
      f2 = f2 + 1;
    }
  }
  while (out._4_4_ != 0) {
    *f1 = *ptStack_20;
    f1 = f1 + 1;
    out._4_4_ = out._4_4_ + -1;
    ptStack_20 = ptStack_20 + 1;
  }
  *(t_sample **)(lVar1 + 0x58) = f1;
  return w + 4;
}

Assistant:

t_int *vinlet_doprolog(t_int *w)
{
    t_vinlet *x = (t_vinlet *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    int n = (int)(w[3]);
    t_sample *out = x->x_fill;
    if (out == x->x_endbuf)
    {
        t_sample *f1 = x->x_buf, *f2 = x->x_buf + x->x_hop;
        int nshift = x->x_bufsize - x->x_hop;
        out -= x->x_hop;
        while (nshift--) *f1++ = *f2++;
    }

    while (n--) *out++ = *in++;
    x->x_fill = out;
    return (w+4);
}